

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateMessageDocComment
               (Printer *printer,Descriptor *message,int is_descriptor)

{
  undefined4 in_EDX;
  Descriptor *in_RSI;
  string local_88 [32];
  string *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  Printer *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  char (*in_stack_ffffffffffffffc0) [9];
  char *in_stack_ffffffffffffffc8;
  Printer *in_stack_ffffffffffffffd0;
  Descriptor *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 in_stack_ffffffffffffffe8;
  
  io::Printer::Print<>(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  GenerateDocCommentBody<google::protobuf::Descriptor>
            ((Printer *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  FullClassName<google::protobuf::Descriptor>
            ((Descriptor *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (bool)in_stack_ffffffffffffffe7);
  EscapePhpdoc(in_stack_ffffffffffffff98);
  Descriptor::full_name_abi_cxx11_(in_RSI);
  EscapePhpdoc(in_stack_ffffffffffffff98);
  io::Printer::Print<char[9],std::__cxx11::string,char[12],std::__cxx11::string>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->variable_delimiter_,
             in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  return;
}

Assistant:

void GenerateMessageDocComment(io::Printer* printer,
                               const Descriptor* message, int is_descriptor) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, message);
  printer->Print(
    " * Generated from protobuf message <code>^messagename^</code>\n"
    " */\n",
    "fullname", EscapePhpdoc(FullClassName(message, is_descriptor)),
    "messagename", EscapePhpdoc(message->full_name()));
}